

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.h
# Opt level: O0

bool __thiscall
JsUtil::
List<JsUtil::Pair<unsigned_int,IR::LabelInstr*,DefaultComparer>,Memory::JitArenaAllocator,false,Js::CopyRemovePolicy,DefaultComparer>
::MapUntilFrom<FlowGraph::Destroy()::__0>
          (List<JsUtil::Pair<unsigned_int,IR::LabelInstr*,DefaultComparer>,Memory::JitArenaAllocator,false,Js::CopyRemovePolicy,DefaultComparer>
           *this,int start,anon_class_16_2_202918d3 map)

{
  bool bVar1;
  int local_30;
  int i;
  int start_local;
  List<JsUtil::Pair<unsigned_int,_IR::LabelInstr_*,_DefaultComparer>,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_local;
  anon_class_16_2_202918d3 map_local;
  
  map_local.this = (FlowGraph *)map.labelInstr;
  this_local = (List<JsUtil::Pair<unsigned_int,_IR::LabelInstr_*,_DefaultComparer>,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                *)map.this;
  local_30 = start;
  while( true ) {
    if (*(int *)(this + 0x10) <= local_30) {
      return false;
    }
    bVar1 = Js::
            CopyRemovePolicy<JsUtil::List<JsUtil::Pair<unsigned_int,_IR::LabelInstr_*,_DefaultComparer>,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_true>
            ::IsItemValid((TElementType *)(*(long *)(this + 8) + (long)local_30 * 0x18));
    if ((bVar1) &&
       (bVar1 = FlowGraph::Destroy::anon_class_16_2_202918d3::operator()
                          ((anon_class_16_2_202918d3 *)&this_local,local_30,
                           (YieldOffsetResumeLabel *)(*(long *)(this + 8) + (long)local_30 * 0x18)),
       bVar1)) break;
    local_30 = local_30 + 1;
  }
  return true;
}

Assistant:

bool MapUntilFrom(int start, TMapFunction map) const
        {
            for (int i = start; i < this->count; i++)
            {
                if (TRemovePolicyType::IsItemValid(this->buffer[i]))
                {
                    if (map(i, this->buffer[i]))
                    {
                        return true;
                    }
                }
            }
            return false;
        }